

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool TwoBytesTest2<Blob<160>>(pfHash hash,int maxlen,bool drawDiagram)

{
  bool bVar1;
  byte in_DL;
  bool result;
  HashCallback<Blob<160>_> c;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  bool in_stack_0000008b;
  bool in_stack_0000008c;
  bool in_stack_0000008d;
  bool in_stack_0000008e;
  bool in_stack_0000008f;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_00000090;
  KeyCallback *in_stack_000000c8;
  int in_stack_000000d4;
  hashvec *hashes_00;
  undefined4 in_stack_ffffffffffffffa8;
  byte bVar2;
  undefined4 in_stack_ffffffffffffffac;
  HashCallback<Blob<160>_> *in_stack_ffffffffffffffb0;
  hashvec local_28;
  byte local_d;
  
  local_d = in_DL & 1;
  hashes_00 = &local_28;
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x175914);
  HashCallback<Blob<160>_>::HashCallback
            (in_stack_ffffffffffffffb0,
             (pfHash)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),hashes_00);
  TwoBytesKeygen(in_stack_000000d4,in_stack_000000c8);
  bVar2 = 1;
  bVar1 = TestHashList<Blob<160>>
                    (in_stack_00000090,in_stack_0000008f,in_stack_0000008e,in_stack_0000008d,
                     in_stack_0000008c,in_stack_0000008b);
  bVar2 = bVar1 & bVar2;
  printf("\n");
  HashCallback<Blob<160>_>::~HashCallback((HashCallback<Blob<160>_> *)0x17599c);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)in_stack_ffffffffffffffb0);
  return (bool)(bVar2 & 1);
}

Assistant:

bool TwoBytesTest2 ( pfHash hash, int maxlen, bool drawDiagram )
{
  std::vector<hashtype> hashes;

  HashCallback<hashtype> c(hash,hashes);

  TwoBytesKeygen(maxlen,c);

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  return result;
}